

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix * __thiscall Matrix::operator-=(Matrix *this,Matrix *mat)

{
  Matrix local_38;
  Matrix *local_18;
  Matrix *mat_local;
  Matrix *this_local;
  
  local_18 = mat;
  mat_local = this;
  operator-(&local_38,this,mat);
  operator=(this,&local_38);
  ~Matrix(&local_38);
  return this;
}

Assistant:

Matrix& Matrix::operator-=(const Matrix& mat){
    *this=(*this)-mat;
    return *this;
}